

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O3

char * VulkanUtilities::VkAccessFlagBitToString(VkAccessFlagBits Bit)

{
  char *pcVar1;
  VkAccessFlagBits VVar2;
  string msg;
  string local_38;
  
  VVar2 = Bit - VK_ACCESS_INDIRECT_COMMAND_READ_BIT;
  if ((Bit ^ VVar2) <= VVar2) {
    Diligent::FormatString<char[23]>(&local_38,(char (*) [23])"Single bit is expected");
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VkAccessFlagBitToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
               ,0x29a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x3ff < (int)Bit) {
    if ((int)Bit < 0x4000) {
      if ((int)Bit < 0x1000) {
        if (Bit == VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT) {
          return "VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT";
        }
        if (Bit == VK_ACCESS_TRANSFER_READ_BIT) {
          return "VK_ACCESS_TRANSFER_READ_BIT";
        }
      }
      else {
        if (Bit == VK_ACCESS_TRANSFER_WRITE_BIT) {
          return "VK_ACCESS_TRANSFER_WRITE_BIT";
        }
        if (Bit == VK_ACCESS_HOST_READ_BIT) {
          return "VK_ACCESS_HOST_READ_BIT";
        }
      }
    }
    else if ((int)Bit < 0x10000) {
      if (Bit == VK_ACCESS_HOST_WRITE_BIT) {
        return "VK_ACCESS_HOST_WRITE_BIT";
      }
      if (Bit == VK_ACCESS_MEMORY_READ_BIT) {
        return "VK_ACCESS_MEMORY_READ_BIT";
      }
    }
    else {
      if (Bit == VK_ACCESS_MEMORY_WRITE_BIT) {
        return "VK_ACCESS_MEMORY_WRITE_BIT";
      }
      if (Bit == VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR) {
        return "VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR";
      }
      if (Bit == VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR) {
        return "VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR";
      }
    }
    goto switchD_0027df1d_caseD_2;
  }
  if (0x1f < (int)Bit) {
    if ((int)Bit < 0x80) {
      if (Bit == VK_ACCESS_SHADER_READ_BIT) {
        return "VK_ACCESS_SHADER_READ_BIT";
      }
      if (Bit == VK_ACCESS_SHADER_WRITE_BIT) {
        return "VK_ACCESS_SHADER_WRITE_BIT";
      }
    }
    else {
      if (Bit == VK_ACCESS_COLOR_ATTACHMENT_READ_BIT) {
        return "VK_ACCESS_COLOR_ATTACHMENT_READ_BIT";
      }
      if (Bit == VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT) {
        return "VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT";
      }
      if (Bit == VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT) {
        return "VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT";
      }
    }
    goto switchD_0027df1d_caseD_2;
  }
  switch(VVar2) {
  case VK_ACCESS_NONE:
    pcVar1 = "VK_ACCESS_INDIRECT_COMMAND_READ_BIT";
    break;
  case VK_ACCESS_INDIRECT_COMMAND_READ_BIT:
    pcVar1 = "VK_ACCESS_INDEX_READ_BIT";
    break;
  case VK_ACCESS_INDEX_READ_BIT|VK_ACCESS_INDIRECT_COMMAND_READ_BIT:
    pcVar1 = "VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT";
    break;
  case VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT|VK_ACCESS_INDEX_READ_BIT|
       VK_ACCESS_INDIRECT_COMMAND_READ_BIT:
    pcVar1 = "VK_ACCESS_UNIFORM_READ_BIT";
    break;
  default:
    if (Bit == VK_ACCESS_INPUT_ATTACHMENT_READ_BIT) {
      return "VK_ACCESS_INPUT_ATTACHMENT_READ_BIT";
    }
  case VK_ACCESS_INDEX_READ_BIT:
  case VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT:
  case VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT|VK_ACCESS_INDIRECT_COMMAND_READ_BIT:
  case VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT|VK_ACCESS_INDEX_READ_BIT:
switchD_0027df1d_caseD_2:
    Diligent::FormatString<char[15]>(&local_38,(char (*) [15])"Unexpected bit");
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VkAccessFlagBitToString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
               ,0x2b3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char* VkAccessFlagBitToString(VkAccessFlagBits Bit)
{
    VERIFY(Bit != 0 && (Bit & (Bit - 1)) == 0, "Single bit is expected");
    switch (Bit)
    {
        // clang-format off
#define ACCESS_FLAG_BIT_TO_STRING(ACCESS_FLAG_BIT)case ACCESS_FLAG_BIT: return #ACCESS_FLAG_BIT;
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_INDIRECT_COMMAND_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_INDEX_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_UNIFORM_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_INPUT_ATTACHMENT_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_SHADER_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_SHADER_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_TRANSFER_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_TRANSFER_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_HOST_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_HOST_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_MEMORY_READ_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_MEMORY_WRITE_BIT)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR)
        ACCESS_FLAG_BIT_TO_STRING(VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR)
#undef ACCESS_FLAG_BIT_TO_STRING
        default: UNEXPECTED("Unexpected bit"); return "";
            // clang-format on
    }
}